

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContext.h
# Opt level: O0

void __thiscall
Diligent::StateTransitionDesc::StateTransitionDesc
          (StateTransitionDesc *this,ITexture *_pTexture,RESOURCE_STATE _OldState,
          RESOURCE_STATE _NewState,STATE_TRANSITION_FLAGS _Flags)

{
  STATE_TRANSITION_FLAGS _Flags_local;
  RESOURCE_STATE _NewState_local;
  RESOURCE_STATE _OldState_local;
  ITexture *_pTexture_local;
  StateTransitionDesc *this_local;
  
  StateTransitionDesc(this,_pTexture,_OldState,_NewState,0,0xffffffff,0,0xffffffff,
                      STATE_TRANSITION_TYPE_IMMEDIATE,_Flags);
  return;
}

Assistant:

constexpr StateTransitionDesc(ITexture*              _pTexture,
                                  RESOURCE_STATE         _OldState,
                                  RESOURCE_STATE         _NewState,
                                  STATE_TRANSITION_FLAGS _Flags) noexcept :
        StateTransitionDesc
        {
            _pTexture,
            _OldState,
            _NewState,
            0,
            REMAINING_MIP_LEVELS,
            0,
            REMAINING_ARRAY_SLICES,
            STATE_TRANSITION_TYPE_IMMEDIATE,
            _Flags
        }
    {}